

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall
re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  const_pointer pcVar4;
  size_type sVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  long in_RCX;
  StringPiece *in_RDX;
  char *in_RSI;
  long in_RDI;
  int in_R8D;
  StringPiece snip;
  int n;
  int c;
  char *end;
  char *s;
  LogMessage *in_stack_fffffffffffffc30;
  LogMessage *this_00;
  undefined8 in_stack_fffffffffffffc50;
  int line;
  char *in_stack_fffffffffffffc58;
  LogMessage *in_stack_fffffffffffffc60;
  int local_37c;
  LogMessage local_368;
  StringPiece local_1e8 [2];
  LogMessage local_1c8;
  int local_48;
  int local_44;
  char *local_40;
  char *local_38;
  int local_2c;
  long local_28;
  StringPiece *local_20;
  char *local_18;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pcVar4 = StringPiece::data(in_RDX);
  local_38 = pcVar4;
  sVar5 = StringPiece::size(local_20);
  local_40 = pcVar4 + sVar5;
  do {
    if (local_40 <= local_38) {
      return true;
    }
    if (*local_38 == '\\') {
      local_38 = local_38 + 1;
      if (local_38 < local_40) {
        local_37c = (int)*local_38;
      }
      else {
        local_37c = -1;
      }
      local_44 = local_37c;
      iVar3 = isdigit(local_37c);
      line = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
      if (iVar3 == 0) {
        if (local_44 != 0x5c) {
          bVar2 = Options::log_errors((Options *)(in_RDI + 0x20));
          if (bVar2) {
            this_00 = &local_368;
            LogMessage::LogMessage(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,line);
            poVar6 = LogMessage::stream(this_00);
            poVar6 = std::operator<<(poVar6,"invalid rewrite pattern: ");
            pcVar4 = StringPiece::data(local_20);
            std::operator<<(poVar6,pcVar4);
            LogMessage::~LogMessage(this_00);
          }
          return false;
        }
        std::__cxx11::string::push_back((char)local_18);
      }
      else {
        local_48 = local_44 + -0x30;
        if (local_2c <= local_48) {
          bVar2 = Options::log_errors((Options *)(in_RDI + 0x20));
          if (bVar2) {
            LogMessage::LogMessage(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,line);
            poVar6 = LogMessage::stream(&local_1c8);
            poVar6 = std::operator<<(poVar6,"requested group ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_48);
            poVar6 = std::operator<<(poVar6," in regexp ");
            pcVar4 = StringPiece::data(local_20);
            std::operator<<(poVar6,pcVar4);
            LogMessage::~LogMessage(in_stack_fffffffffffffc30);
          }
          return false;
        }
        puVar7 = (undefined8 *)(local_28 + (long)local_48 * 0x10);
        local_1e8[0].data_ = (const_pointer)*puVar7;
        local_1e8[0].size_ = puVar7[1];
        sVar5 = StringPiece::size(local_1e8);
        pcVar1 = local_18;
        if (sVar5 != 0) {
          pcVar4 = StringPiece::data(local_1e8);
          StringPiece::size(local_1e8);
          std::__cxx11::string::append(pcVar1,(ulong)pcVar4);
        }
      }
    }
    else {
      std::__cxx11::string::push_back((char)local_18);
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool RE2::Rewrite(std::string* out,
                  const StringPiece& rewrite,
                  const StringPiece* vec,
                  int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "requested group " << n
                     << " in regexp " << rewrite.data();
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (snip.size() > 0)
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}